

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg.c
# Opt level: O2

reg_t * reg_get_by_id(int id,int ver)

{
  reg_t *prVar1;
  list_t *plVar2;
  
  if ((ver - 2U < 7) && ((0x67U >> (ver - 2U & 0x1f) & 1) != 0)) {
    for (prVar1 = regs_v2_v3_v4_v7_v8; prVar1->type != 0; prVar1 = prVar1 + 1) {
      if (prVar1->id == id) {
        return prVar1;
      }
    }
  }
  plVar2 = &regs_user;
  do {
    plVar2 = (list_t *)((list_node_t *)plVar2)->next;
    if ((list_node_t *)plVar2 == (list_node_t *)0x0) {
      return (reg_t *)0x0;
    }
  } while (((reg_t *)((list_node_t *)plVar2)->data)->id != id);
  return (reg_t *)((list_node_t *)plVar2)->data;
}

Assistant:

reg_t*
reg_get_by_id(
    int id,
    int ver
) {
    reg_t* table = reg_get_table(ver);
    if (table) {
        while(table->type) {
            if (table->id == id)
                return table;
            ++table;
        }
    }
    list_for_each(&regs_user, table) {
        if (table->id == id)
            return table;
    }
    return NULL;
}